

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Button::draw(Button *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  Theme *pTVar4;
  ALLEGRO_COLOR *pAVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  Theme *pTVar9;
  Theme *pTVar10;
  undefined4 in_XMM1_Da;
  undefined8 in_XMM2_Qa;
  undefined4 uVar13;
  double dVar11;
  undefined8 uVar12;
  undefined8 in_XMM3_Qa;
  undefined4 uVar14;
  undefined8 uVar15;
  undefined4 local_468;
  undefined4 local_458;
  undefined4 local_438;
  SaveState state;
  
  uVar14 = (undefined4)((ulong)in_XMM3_Qa >> 0x20);
  uVar13 = (undefined4)((ulong)in_XMM2_Qa >> 0x20);
  pTVar4 = ((this->super_Widget).dialog)->theme;
  al_store_state(&state,0xffff);
  if (this->pushed == true) {
    pAVar5 = &pTVar4->bg;
    lVar8 = 0x18;
    pTVar9 = (Theme *)&pTVar4->fg;
    pTVar10 = pTVar4;
  }
  else {
    pTVar10 = (Theme *)&pTVar4->fg;
    pAVar5 = &pTVar4->fg;
    lVar8 = 8;
    pTVar9 = pTVar4;
  }
  uVar1._0_4_ = pAVar5->b;
  uVar1._4_4_ = pAVar5->a;
  uVar2._0_4_ = (pTVar10->bg).r;
  uVar2._4_4_ = (pTVar10->bg).g;
  uVar12 = *(undefined8 *)((long)&(pTVar4->bg).r + lVar8);
  uVar15._0_4_ = (pTVar9->bg).r;
  uVar15._4_4_ = (pTVar9->bg).g;
  iVar6 = (*(this->super_Widget)._vptr_Widget[0x10])(this);
  local_438 = (undefined4)uVar12;
  if ((char)iVar6 != '\0') {
    local_438 = in_XMM1_Da;
    uVar15 = al_map_rgb(0x40,0x40,0x40);
  }
  al_draw_filled_rectangle
            ((float)(this->super_Widget).x1,(float)(this->super_Widget).y1,
             CONCAT44(uVar13,(float)(this->super_Widget).x2),
             CONCAT44(uVar14,(float)(this->super_Widget).y2),uVar15,local_438);
  dVar11 = (double)(this->super_Widget).x2 + -0.5;
  uVar12 = CONCAT44((int)((ulong)dVar11 >> 0x20),(float)dVar11);
  uVar15 = CONCAT44(0xbfe00000,(float)(this->super_Widget).y2 + -0.5);
  al_draw_rectangle((float)(this->super_Widget).x1 + 0.5,
                    CONCAT44(0x3fe00000,(float)(this->super_Widget).y1 + 0.5),uVar12,uVar15,uVar2,
                    (undefined4)uVar1,0);
  uVar14 = (undefined4)((ulong)uVar15 >> 0x20);
  uVar13 = (undefined4)((ulong)uVar12 >> 0x20);
  al_set_blender(0,1,3);
  iVar6 = (this->super_Widget).y1;
  iVar3 = (this->super_Widget).y2;
  uVar7 = al_get_font_line_height(pTVar4->font);
  al_draw_text((undefined4)uVar2,uVar1,
               CONCAT44(uVar13,(float)(((this->super_Widget).x1 + (this->super_Widget).x2 + 1) / 2))
               ,CONCAT44(uVar14,(float)((int)(~uVar7 + iVar3 + iVar6) / 2)),pTVar4->font,1,
               (this->text)._M_dataplus._M_p);
  anon_unknown.dwarf_a2e9::SaveState::~SaveState(&state);
  return;
}

Assistant:

void Button::draw()
{
   const Theme & theme = this->dialog->get_theme();
   ALLEGRO_COLOR fg;
   ALLEGRO_COLOR bg;
   SaveState state;
   double y;

   if (this->pushed) {
      fg = theme.bg;
      bg = theme.fg;
   }
   else {
      fg = theme.fg;
      bg = theme.bg;
   }

   if (is_disabled()) {
      bg = al_map_rgb(64, 64, 64);
   }

   al_draw_filled_rectangle(this->x1, this->y1,
      this->x2, this->y2, bg);
   al_draw_rectangle(this->x1 + 0.5, this->y1 + 0.5,
      this->x2 - 0.5, this->y2 - 0.5, fg, 0);
   al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_INVERSE_ALPHA);

   /* Center the text vertically in the button, taking the font size
    * into consideration.
    */
   y = (this->y1 + this->y2 - al_get_font_line_height(theme.font) - 1) / 2;

   al_draw_text(theme.font, fg, (this->x1 + this->x2 + 1)/2,
      y, ALLEGRO_ALIGN_CENTRE, this->text.c_str());
}